

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboInvalidateTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::InvalidateSubFboUnbindBlitCase::InvalidateSubFboUnbindBlitCase
          (InvalidateSubFboUnbindBlitCase *this,Context *context,char *name,char *description,
          int numSamples,deUint32 invalidateBuffers)

{
  deUint32 dVar1;
  RenderTarget *pRVar2;
  
  FboTestCase::FboTestCase(&this->super_FboTestCase,context,name,description,0 < numSamples);
  (this->super_FboTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__FboTestCase_01e3c9a0;
  this->m_colorFmt = 0;
  this->m_depthStencilFmt = 0;
  this->m_numSamples = numSamples;
  this->m_invalidateBuffers = invalidateBuffers;
  pRVar2 = Context::getRenderTarget((this->super_FboTestCase).super_TestCase.m_context);
  dVar1 = getCompatibleColorFormat(pRVar2);
  this->m_colorFmt = dVar1;
  pRVar2 = Context::getRenderTarget((this->super_FboTestCase).super_TestCase.m_context);
  dVar1 = getCompatibleDepthStencilFormat(pRVar2);
  this->m_depthStencilFmt = dVar1;
  return;
}

Assistant:

InvalidateSubFboUnbindBlitCase (Context& context, const char* name, const char* description, int numSamples, deUint32 invalidateBuffers)
		: FboTestCase			(context, name, description, numSamples > 0)	// \note Use fullscreen viewport when multisampling - we can't allow GLES3Context do its
																				//		 behing-the-scenes viewport position randomization, because with glBlitFramebuffer,
																				//		 source and destination rectangles must match when multisampling.
		, m_colorFmt			(0)
		, m_depthStencilFmt		(0)
		, m_numSamples			(numSamples)
		, m_invalidateBuffers	(invalidateBuffers)
	{
		// Figure out formats that are compatible with default framebuffer.
		m_colorFmt			= getCompatibleColorFormat(m_context.getRenderTarget());
		m_depthStencilFmt	= getCompatibleDepthStencilFormat(m_context.getRenderTarget());
	}